

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall wasm::Wasm2JSBuilder::addBasics(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  IString name;
  IString name_00;
  IString name_01;
  IString name_02;
  IString name_03;
  IString name_04;
  IString name_05;
  IString name_06;
  IString name_07;
  IString name_08;
  IString name_09;
  IString name_10;
  IString name_11;
  IString name_12;
  IString name_13;
  IString name_14;
  IString name_15;
  IString name_16;
  IString view;
  IString view_00;
  IString view_01;
  IString view_02;
  IString view_03;
  IString view_04;
  IString view_05;
  IString view_06;
  IString base;
  IString base_00;
  IString base_01;
  IString base_02;
  IString base_03;
  IString base_04;
  IString base_05;
  IString base_06;
  IString base_07;
  IString base_08;
  anon_class_8_1_ba1d35e2 local_20;
  anon_class_8_1_ba1d35e2 addMath;
  Ref ast_local;
  
  addMath.ast = (Ref *)ast.inst;
  if ((wasm->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (wasm->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_20.ast = (Ref *)&addMath;
    name.str._M_str = DAT_011753c0;
    name.str._M_len = cashew::HEAP8;
    view.str._M_str = DAT_011749d8;
    view.str._M_len = INT8ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name,view);
    name_00.str._M_str = DAT_011753d0;
    name_00.str._M_len = cashew::HEAP16;
    view_00.str._M_str = DAT_011749e8;
    view_00.str._M_len = INT16ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_00,view_00);
    name_01.str._M_str = DAT_011753e0;
    name_01.str._M_len = cashew::HEAP32;
    view_01.str._M_str = DAT_011749f8;
    view_01.str._M_len = INT32ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_01,view_01);
    name_02.str._M_str = DAT_01175400;
    name_02.str._M_len = cashew::HEAPU8;
    view_02.str._M_str = DAT_01174a08;
    view_02.str._M_len = UINT8ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_02,view_02);
    name_03.str._M_str = DAT_01175410;
    name_03.str._M_len = cashew::HEAPU16;
    view_03.str._M_str = DAT_01174a18;
    view_03.str._M_len = UINT16ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_03,view_03);
    name_04.str._M_str = DAT_01175420;
    name_04.str._M_len = cashew::HEAPU32;
    view_04.str._M_str = DAT_01174a28;
    view_04.str._M_len = UINT32ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_04,view_04);
    name_05.str._M_str = DAT_011753f0;
    name_05.str._M_len = cashew::HEAPF32;
    view_05.str._M_str = DAT_01174a38;
    view_05.str._M_len = FLOAT32ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_05,view_05);
    name_06.str._M_str = DAT_01175430;
    name_06.str._M_len = cashew::HEAPF64;
    view_06.str._M_str = DAT_01174a48;
    view_06.str._M_len = FLOAT64ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_06,view_06);
  }
  local_20.ast = (Ref *)&addMath;
  name_07.str._M_str = DAT_01174c98;
  name_07.str._M_len = MATH_IMUL;
  base.str._M_str = DAT_01174a88;
  base.str._M_len = IMUL;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_07,base);
  name_08.str._M_str = DAT_01175200;
  name_08.str._M_len = cashew::MATH_FROUND;
  base_00.str._M_str = DAT_01174aa8;
  base_00.str._M_len = FROUND;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_08,base_00);
  name_09.str._M_str = DAT_01174ca8;
  name_09.str._M_len = MATH_ABS;
  base_01.str._M_str = DAT_01174bb8;
  base_01.str._M_len = ABS;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_09,base_01);
  name_10.str._M_str = DAT_01174cc8;
  name_10.str._M_len = MATH_CLZ32;
  base_02.str._M_str = DAT_01174a98;
  base_02.str._M_len = CLZ32;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_10,base_02);
  name_11.str._M_str = DAT_01174d08;
  name_11.str._M_len = MATH_MIN;
  base_03.str._M_str = DAT_01174ac8;
  base_03.str._M_len = MIN;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_11,base_03);
  name_12.str._M_str = DAT_01174d18;
  name_12.str._M_len = MATH_MAX;
  base_04.str._M_str = DAT_01174ad8;
  base_04.str._M_len = MAX;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_12,base_04);
  name_13.str._M_str = DAT_01174cd8;
  name_13.str._M_len = MATH_FLOOR;
  base_05.str._M_str = DAT_01174bc8;
  base_05.str._M_len = FLOOR;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_13,base_05);
  name_14.str._M_str = DAT_01174cb8;
  name_14.str._M_len = MATH_CEIL;
  base_06.str._M_str = DAT_01174bd8;
  base_06.str._M_len = CEIL;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_14,base_06);
  name_15.str._M_str = DAT_01174ce8;
  name_15.str._M_len = MATH_TRUNC;
  base_07.str._M_str = DAT_01174be8;
  base_07.str._M_len = TRUNC;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_15,base_07);
  name_16.str._M_str = DAT_01174cf8;
  name_16.str._M_len = MATH_SQRT;
  base_08.str._M_str = DAT_01174bf8;
  base_08.str._M_len = SQRT;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_20,name_16,base_08);
  return;
}

Assistant:

void Wasm2JSBuilder::addBasics(Ref ast, Module* wasm) {
  if (!wasm->memories.empty()) {
    // heaps, var HEAP8 = new global.Int8Array(buffer); etc
    auto addHeap = [&](IString name, IString view) {
      Ref theVar = ValueBuilder::makeVar();
      ast->push_back(theVar);
      ValueBuilder::appendToVar(theVar,
                                name,
                                ValueBuilder::makeNew(ValueBuilder::makeCall(
                                  view, ValueBuilder::makeName(BUFFER))));
    };
    addHeap(HEAP8, INT8ARRAY);
    addHeap(HEAP16, INT16ARRAY);
    addHeap(HEAP32, INT32ARRAY);
    addHeap(HEAPU8, UINT8ARRAY);
    addHeap(HEAPU16, UINT16ARRAY);
    addHeap(HEAPU32, UINT32ARRAY);
    addHeap(HEAPF32, FLOAT32ARRAY);
    addHeap(HEAPF64, FLOAT64ARRAY);
  }
  // core asm.js imports
  auto addMath = [&](IString name, IString base) {
    Ref theVar = ValueBuilder::makeVar();
    ast->push_back(theVar);
    ValueBuilder::appendToVar(
      theVar, name, ValueBuilder::makeDot(ValueBuilder::makeName(MATH), base));
  };
  addMath(MATH_IMUL, IMUL);
  addMath(MATH_FROUND, FROUND);
  addMath(MATH_ABS, ABS);
  addMath(MATH_CLZ32, CLZ32);
  addMath(MATH_MIN, MIN);
  addMath(MATH_MAX, MAX);
  addMath(MATH_FLOOR, FLOOR);
  addMath(MATH_CEIL, CEIL);
  addMath(MATH_TRUNC, TRUNC);
  addMath(MATH_SQRT, SQRT);
}